

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O2

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  byte ch;
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  upb_MiniTableEnum *puVar6;
  uint uVar7;
  uint uVar8;
  uint val;
  uint uVar9;
  char *fmt;
  ulong uVar10;
  
  iVar4 = __sigsetjmp((decoder->base).err,0);
  if (iVar4 == 0) {
    if (len != 0) {
      if (*data != '!') {
        fmt = "Invalid enum version: %c";
LAB_0024f9bf:
        upb_MdDecoder_ErrorJmp(&decoder->base,fmt);
      }
      data = data + 1;
    }
    upb_MdDecoder_CheckOutOfMemory(&decoder->base,decoder->enum_table);
    decoder->enum_table->mask_limit_dont_copy_me__upb_internal_use_only = 0x40;
    val = 0;
    puVar6 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar6;
    puVar6 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar6;
    puVar6->value_count_dont_copy_me__upb_internal_use_only = 0;
    while (pbVar1 = (byte *)(decoder->base).end, data < pbVar1) {
      ch = *data;
      uVar8 = (uint)(char)ch;
      data = (char *)((byte *)data + 1);
      if ((int)uVar8 < 0x42) {
        cVar3 = _upb_FromBase92(ch);
        uVar10 = (ulong)(uint)(int)cVar3;
        for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
          if ((uVar10 & 1) != 0) {
            puVar6 = decoder->enum_table;
            uVar8 = decoder->enum_value_count + 1;
            decoder->enum_value_count = uVar8;
            if (puVar6->value_count_dont_copy_me__upb_internal_use_only == 0) {
              uVar7 = puVar6->mask_limit_dont_copy_me__upb_internal_use_only;
              if (val >> 5 <= uVar8 || val < 0x201) {
                while (uVar7 < (val & 0xffffffe0) + 0x20) {
                  puVar6 = _upb_MiniTable_AddEnumDataMember(decoder,0);
                  uVar7 = puVar6->mask_limit_dont_copy_me__upb_internal_use_only + 0x20;
                  puVar6->mask_limit_dont_copy_me__upb_internal_use_only = uVar7;
                }
                (&puVar6[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] =
                     (&puVar6[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] |
                     1 << ((byte)val & 0x1f);
                goto LAB_0024f893;
              }
              if (decoder->enum_data_count != uVar7 >> 5) {
                __assert_fail("d->enum_data_count == table->mask_limit_dont_copy_me__upb_internal_use_only / 32"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/build_enum.c"
                              ,0x40,
                              "void upb_MiniTableEnum_BuildValue(upb_MdEnumDecoder *, uint32_t)");
              }
            }
            puVar6 = _upb_MiniTable_AddEnumDataMember(decoder,val);
            puVar6->value_count_dont_copy_me__upb_internal_use_only =
                 puVar6->value_count_dont_copy_me__upb_internal_use_only + 1;
          }
LAB_0024f893:
          val = val + 1;
          uVar10 = uVar10 >> 1;
        }
      }
      else {
        if (0x1f < (byte)(ch + 0xa1)) {
          fmt = "Unexpected character: %c";
          goto LAB_0024f9bf;
        }
        for (uVar7 = 0x1f; 0x1eU >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
        uVar5 = 0;
        uVar9 = uVar5;
        while( true ) {
          cVar3 = _upb_FromBase92((uint8_t)uVar8);
          uVar5 = cVar3 + -0x3c << ((byte)uVar9 & 0x1f) | uVar5;
          pbVar2 = pbVar1;
          if (((byte *)data == pbVar1) ||
             (uVar8 = (uint)(byte)*data, pbVar2 = (byte *)data, (byte)(*data + 0x81U) < 0xe0))
          break;
          data = (char *)((byte *)data + 1);
          uVar9 = uVar9 + (uVar7 ^ 0xffffffe0) + 0x21;
          if (0x1f < uVar9) {
            upb_MdDecoder_ErrorJmp(&decoder->base,"Overlong varint");
          }
        }
        data = (char *)pbVar2;
        val = uVar5 + val;
      }
    }
    puVar6 = decoder->enum_table;
  }
  else {
    puVar6 = (upb_MiniTableEnum *)0x0;
  }
  return puVar6;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}